

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O1

void doInsertionSort(char *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
                    void *pv)

{
  uint uVar1;
  ulong __n;
  char *item;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  char *__src;
  
  if (1 < length) {
    __n = (ulong)(uint)itemSize;
    item = array + itemSize;
    uVar3 = 1;
    do {
      uVar1 = uprv_stableBinarySearch_63(array,(int32_t)uVar3,item,itemSize,cmp,context);
      uVar4 = ~uVar1;
      if (-1 < (int)uVar1) {
        uVar4 = uVar1 + 1;
      }
      lVar2 = uVar3 - (long)(int)uVar4;
      if (lVar2 != 0 && (long)(int)uVar4 <= (long)uVar3) {
        __src = array + uVar4 * itemSize;
        memcpy(pv,item,__n);
        memmove(__src + __n,__src,lVar2 * __n);
        memcpy(__src,pv,__n);
      }
      uVar3 = uVar3 + 1;
      item = item + itemSize;
    } while ((uint)length != uVar3);
  }
  return;
}

Assistant:

static void
doInsertionSort(char *array, int32_t length, int32_t itemSize,
                UComparator *cmp, const void *context, void *pv) {
    int32_t j;

    for(j=1; j<length; ++j) {
        char *item=array+j*itemSize;
        int32_t insertionPoint=uprv_stableBinarySearch(array, j, item, itemSize, cmp, context);
        if(insertionPoint<0) {
            insertionPoint=~insertionPoint;
        } else {
            ++insertionPoint;  /* one past the last equal item */
        }
        if(insertionPoint<j) {
            char *dest=array+insertionPoint*itemSize;
            uprv_memcpy(pv, item, itemSize);  /* v=array[j] */
            uprv_memmove(dest+itemSize, dest, (j-insertionPoint)*(size_t)itemSize);
            uprv_memcpy(dest, pv, itemSize);  /* array[insertionPoint]=v */
        }
    }
}